

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O2

QString * __thiscall
QMap<QString,_QString>::value
          (QString *__return_storage_ptr__,QMap<QString,_QString> *this,QString *key,
          QString *defaultValue)

{
  QMapData<std::map<QString,_QString,_std::less<QString>,_std::allocator<std::pair<const_QString,_QString>_>_>_>
  *pQVar1;
  const_iterator cVar2;
  
  pQVar1 = (this->d).d.ptr;
  if (pQVar1 != (QMapData<std::map<QString,_QString,_std::less<QString>,_std::allocator<std::pair<const_QString,_QString>_>_>_>
                 *)0x0) {
    cVar2 = std::
            _Rb_tree<QString,_std::pair<const_QString,_QString>,_std::_Select1st<std::pair<const_QString,_QString>_>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QString>_>_>
            ::find(&(pQVar1->m)._M_t,key);
    if ((_Rb_tree_header *)cVar2._M_node !=
        &(((this->d).d.ptr)->m)._M_t._M_impl.super__Rb_tree_header) {
      defaultValue = (QString *)&cVar2._M_node[1]._M_right;
    }
  }
  QArrayDataPointer<char16_t>::QArrayDataPointer(&__return_storage_ptr__->d,&defaultValue->d);
  return __return_storage_ptr__;
}

Assistant:

T value(const Key &key, const T &defaultValue = T()) const
    {
        if (!d)
            return defaultValue;
        const auto i = d->m.find(key);
        if (i != d->m.cend())
            return i->second;
        return defaultValue;
    }